

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O1

void __thiscall RTLsTy::LoadRTLs(RTLsTy *this)

{
  int32_t iVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  RTLInfoTy R;
  RTLInfoTy local_c0;
  
  TargetOffloadPolicy = __kmpc_get_target_offload();
  if (TargetOffloadPolicy != tgt_disabled) {
    lVar4 = 0;
    do {
      pvVar2 = (void *)dlopen(*(undefined8 *)((long)RTLNames + lVar4),2);
      if (pvVar2 != (void *)0x0) {
        local_c0.Idx = -1;
        local_c0.NumberOfDevices = -1;
        local_c0.run_team_region._0_1_ = 0;
        local_c0.run_team_region._1_7_ = 0;
        local_c0.data_delete = (data_delete_ty *)0x0;
        local_c0.run_region._0_1_ = 0;
        local_c0.run_region._1_7_ = 0;
        local_c0.data_submit = (undefined1 *)0x0;
        local_c0.data_retrieve = (undefined1 *)0x0;
        local_c0.load_binary = (load_binary_ty *)0x0;
        local_c0.data_alloc = (data_alloc_ty *)0x0;
        local_c0.number_of_devices = (number_of_devices_ty *)0x0;
        local_c0.init_device = (init_device_ty *)0x0;
        local_c0.is_valid_binary = (is_valid_binary_ty *)0x0;
        local_c0.Mtx.super___mutex_base._M_mutex._16_8_ = 0;
        local_c0.Mtx.super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        local_c0.Mtx.super___mutex_base._M_mutex.__align = 0;
        local_c0.Mtx.super___mutex_base._M_mutex._8_8_ = 0;
        local_c0.Mtx.super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        local_c0.isUsed = false;
        local_c0.LibraryHandler = pvVar2;
        local_c0.is_valid_binary = (is_valid_binary_ty *)dlsym(pvVar2,"__tgt_rtl_is_valid_binary");
        if (local_c0.is_valid_binary != (is_valid_binary_ty *)0x0) {
          local_c0.number_of_devices =
               (number_of_devices_ty *)dlsym(pvVar2,"__tgt_rtl_number_of_devices");
          if (local_c0.number_of_devices != (number_of_devices_ty *)0x0) {
            local_c0.init_device = (init_device_ty *)dlsym(pvVar2,"__tgt_rtl_init_device");
            if (local_c0.init_device != (init_device_ty *)0x0) {
              local_c0.load_binary = (load_binary_ty *)dlsym(pvVar2,"__tgt_rtl_load_binary");
              if (local_c0.load_binary != (load_binary_ty *)0x0) {
                local_c0.data_alloc = (data_alloc_ty *)dlsym(pvVar2,"__tgt_rtl_data_alloc");
                if (local_c0.data_alloc != (data_alloc_ty *)0x0) {
                  local_c0.data_submit = (undefined1 *)dlsym(pvVar2,"__tgt_rtl_data_submit");
                  if (local_c0.data_submit != (undefined1 *)0x0) {
                    local_c0.data_retrieve = (undefined1 *)dlsym(pvVar2,"__tgt_rtl_data_retrieve");
                    if (local_c0.data_retrieve != (undefined1 *)0x0) {
                      local_c0.data_delete = (data_delete_ty *)dlsym(pvVar2,"__tgt_rtl_data_delete")
                      ;
                      if (local_c0.data_delete != (data_delete_ty *)0x0) {
                        lVar3 = dlsym(pvVar2,"__tgt_rtl_run_target_region");
                        local_c0.run_region._0_1_ = (undefined1)lVar3;
                        local_c0.run_region._1_7_ = (undefined7)((ulong)lVar3 >> 8);
                        if (lVar3 != 0) {
                          lVar3 = dlsym(pvVar2,"__tgt_rtl_run_target_team_region");
                          local_c0.run_team_region._0_1_ = (undefined1)lVar3;
                          local_c0.run_team_region._1_7_ = (undefined7)((ulong)lVar3 >> 8);
                          if (lVar3 != 0) {
                            iVar1 = (*local_c0.number_of_devices)();
                            local_c0.NumberOfDevices = iVar1;
                            if (iVar1 != 0) {
                              std::__cxx11::list<RTLInfoTy,std::allocator<RTLInfoTy>>::
                              _M_insert<RTLInfoTy_const&>
                                        ((list<RTLInfoTy,std::allocator<RTLInfoTy>> *)&this->AllRTLs
                                         ,(iterator)&this->AllRTLs,&local_c0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x20);
  }
  return;
}

Assistant:

void RTLsTy::LoadRTLs() {
#ifdef OMPTARGET_DEBUG
  if (char *envStr = getenv("LIBOMPTARGET_DEBUG")) {
    DebugLevel = std::stoi(envStr);
  }
#endif // OMPTARGET_DEBUG

  // Parse environment variable OMP_TARGET_OFFLOAD (if set)
  TargetOffloadPolicy = (kmp_target_offload_kind_t) __kmpc_get_target_offload();
  if (TargetOffloadPolicy == tgt_disabled) {
    return;
  }

  DP("Loading RTLs...\n");

  // Attempt to open all the plugins and, if they exist, check if the interface
  // is correct and if they are supporting any devices.
  for (auto *Name : RTLNames) {
    DP("Loading library '%s'...\n", Name);
    void *dynlib_handle = dlopen(Name, RTLD_NOW);

    if (!dynlib_handle) {
      // Library does not exist or cannot be found.
      DP("Unable to load library '%s': %s!\n", Name, dlerror());
      continue;
    }

    DP("Successfully loaded library '%s'!\n", Name);

    // Retrieve the RTL information from the runtime library.
    RTLInfoTy R;

    R.LibraryHandler = dynlib_handle;
    R.isUsed = false;

#ifdef OMPTARGET_DEBUG
    R.RTLName = Name;
#endif

    if (!(*((void**) &R.is_valid_binary) = dlsym(
              dynlib_handle, "__tgt_rtl_is_valid_binary")))
      continue;
    if (!(*((void**) &R.number_of_devices) = dlsym(
              dynlib_handle, "__tgt_rtl_number_of_devices")))
      continue;
    if (!(*((void**) &R.init_device) = dlsym(
              dynlib_handle, "__tgt_rtl_init_device")))
      continue;
    if (!(*((void**) &R.load_binary) = dlsym(
              dynlib_handle, "__tgt_rtl_load_binary")))
      continue;
    if (!(*((void**) &R.data_alloc) = dlsym(
              dynlib_handle, "__tgt_rtl_data_alloc")))
      continue;
    if (!(*((void**) &R.data_submit) = dlsym(
              dynlib_handle, "__tgt_rtl_data_submit")))
      continue;
    if (!(*((void**) &R.data_retrieve) = dlsym(
              dynlib_handle, "__tgt_rtl_data_retrieve")))
      continue;
    if (!(*((void**) &R.data_delete) = dlsym(
              dynlib_handle, "__tgt_rtl_data_delete")))
      continue;
    if (!(*((void**) &R.run_region) = dlsym(
              dynlib_handle, "__tgt_rtl_run_target_region")))
      continue;
    if (!(*((void**) &R.run_team_region) = dlsym(
              dynlib_handle, "__tgt_rtl_run_target_team_region")))
      continue;

    // No devices are supported by this RTL?
    if (!(R.NumberOfDevices = R.number_of_devices())) {
      DP("No devices supported in this RTL\n");
      continue;
    }

    DP("Registering RTL %s supporting %d devices!\n",
        R.RTLName.c_str(), R.NumberOfDevices);

    // The RTL is valid! Will save the information in the RTLs list.
    AllRTLs.push_back(R);
  }

  DP("RTLs loaded!\n");

  return;
}